

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int getEndIslands(EndIsland *islands,int mc,uint64_t seed,int chunkX,int chunkZ)

{
  int iVar1;
  int iVar2;
  uint64_t value;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  long lStack_50;
  Xoroshiro xr;
  
  if (mc < 0x15) {
    if (mc < 0x10) {
      return 0;
    }
    fVar6 = 14.0;
  }
  else {
    fVar6 = 0.071428575;
  }
  iVar4 = chunkX * 0x10;
  iVar3 = chunkZ * 0x10;
  value = getPopulationSeed(mc,seed,iVar4,iVar3);
  if (mc < 0x15) {
    xr.lo = value & 0xffffffffffff ^ 0x5deece66d;
    iVar1 = nextInt(&xr.lo,(int)fVar6);
    if (iVar1 != 0) {
      return 0;
    }
    iVar1 = nextInt(&xr.lo,0x10);
    islands->x = iVar1 + iVar4;
    iVar1 = nextInt(&xr.lo,0x10);
    islands->y = iVar1 + 0x37;
    iVar1 = nextInt(&xr.lo,0x10);
    islands->z = iVar1 + iVar3;
    iVar1 = nextInt(&xr.lo,4);
    if (iVar1 != 0) {
      iVar3 = nextInt(&xr.lo,3);
      iVar4 = 1;
      lStack_50 = 0xc;
      goto LAB_00107025;
    }
    iVar1 = nextInt(&xr.lo,0x10);
    islands[1].x = iVar1 + iVar4;
    iVar4 = nextInt(&xr.lo,0x10);
    islands[1].y = iVar4 + 0x37;
    iVar4 = nextInt(&xr.lo,0x10);
    islands[1].z = iVar4 + iVar3;
    iVar3 = nextInt(&xr.lo,3);
    islands->r = iVar3 + 4;
    for (fVar6 = (float)(iVar3 + 4); 0.5 < fVar6; fVar6 = fVar6 - ((float)iVar3 + 0.5)) {
      iVar3 = nextInt(&xr.lo,2);
    }
LAB_0010701e:
    iVar3 = nextInt(&xr.lo,3);
  }
  else {
    if (mc == 0x15) {
      xr.lo = (value ^ 0x5deece66d) * 0x5deece66d + 0xb & 0xffffffffffff;
      if (fVar6 <= (float)(int)(xr.lo >> 0x18) * 5.9604645e-08) {
        return 0;
      }
      iVar1 = nextInt(&xr.lo,4);
      iVar2 = nextInt(&xr.lo,0x10);
      islands->x = iVar2 + iVar4;
      iVar2 = nextInt(&xr.lo,0x10);
      islands->z = iVar2 + iVar3;
      iVar2 = nextInt(&xr.lo,0x10);
      islands->y = iVar2 + 0x37;
      iVar2 = nextInt(&xr.lo,3);
      islands->r = iVar2 + 4;
      for (fVar6 = (float)(iVar2 + 4); 0.5 < fVar6; fVar6 = fVar6 - ((float)iVar2 + 0.5)) {
        iVar2 = nextInt(&xr.lo,2);
      }
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = nextInt(&xr.lo,0x10);
      islands[1].x = iVar1 + iVar4;
      iVar4 = nextInt(&xr.lo,0x10);
      islands[1].z = iVar4 + iVar3;
      iVar3 = nextInt(&xr.lo,0x10);
      islands[1].y = iVar3 + 0x37;
      goto LAB_0010701e;
    }
    xSetSeed(&xr,value);
    fVar5 = xNextFloat(&xr);
    if (fVar6 <= fVar5) {
      return 0;
    }
    iVar1 = xNextIntJ(&xr,4);
    iVar2 = xNextIntJ(&xr,0x10);
    islands->x = iVar2 + iVar4;
    iVar2 = xNextIntJ(&xr,0x10);
    islands->z = iVar2 + iVar3;
    iVar2 = xNextIntJ(&xr,0x10);
    islands->y = iVar2 + 0x37;
    iVar2 = xNextIntJ(&xr,3);
    islands->r = iVar2 + 4;
    if (iVar1 != 3) {
      return 1;
    }
    for (fVar6 = (float)(iVar2 + 4); 0.5 < fVar6; fVar6 = fVar6 - ((float)iVar1 + 0.5)) {
      iVar1 = xNextIntJ(&xr,2);
    }
    iVar1 = xNextIntJ(&xr,0x10);
    islands[1].x = iVar1 + iVar4;
    iVar4 = xNextIntJ(&xr,0x10);
    islands[1].z = iVar4 + iVar3;
    iVar3 = xNextIntJ(&xr,0x10);
    islands[1].y = iVar3 + 0x37;
    iVar3 = xNextIntJ(&xr,3);
  }
  iVar4 = 2;
  lStack_50 = 0x1c;
LAB_00107025:
  *(int *)((long)&islands->x + lStack_50) = iVar3 + 4;
  return iVar4;
}

Assistant:

int getEndIslands(EndIsland islands[2], int mc, uint64_t seed, int chunkX, int chunkZ)
{
    StructureConfig sconf;
    if (!getStructureConfig(End_Island, mc, &sconf))
        return 0;

    int x = chunkX * 16;
    int z = chunkZ * 16;
    uint64_t rng = getPopulationSeed(mc, seed, x, z);
    Xoroshiro xr;
    float r;

    if (mc <= MC_1_16)
    {
        setSeed(&rng, rng + sconf.salt);
        if (nextInt(&rng, (int)sconf.rarity) != 0)
            return 0;
        islands[0].x = nextInt(&rng, 16) + x;
        islands[0].y = nextInt(&rng, 16) + 55;
        islands[0].z = nextInt(&rng, 16) + z;
        if (nextInt(&rng, 4) != 0)
        {
            islands[0].r = nextInt(&rng, 3) + 4;
            return 1;
        }
        islands[1].x = nextInt(&rng, 16) + x;
        islands[1].y = nextInt(&rng, 16) + 55;
        islands[1].z = nextInt(&rng, 16) + z;
        islands[0].r = nextInt(&rng, 3) + 4;
        for (r = islands[0].r; r > 0.5; r -= nextInt(&rng, 2) + 0.5);
        islands[1].r = nextInt(&rng, 3) + 4;
        return 2;
    }
    else if (mc <= MC_1_17)
    {
        setSeed(&rng, rng + sconf.salt);
        if (nextFloat(&rng) >= sconf.rarity)
            return 0;
        int second = nextInt(&rng, 4) == 0;
        islands[0].x = nextInt(&rng, 16) + x;
        islands[0].z = nextInt(&rng, 16) + z;
        islands[0].y = nextInt(&rng, 16) + 55;
        islands[0].r = nextInt(&rng, 3) + 4;
        for (r = islands[0].r; r > 0.5; r -= nextInt(&rng, 2) + 0.5);
        if (!second)
            return 1;
        islands[1].x = nextInt(&rng, 16) + x;
        islands[1].z = nextInt(&rng, 16) + z;
        islands[1].y = nextInt(&rng, 16) + 55;
        islands[1].r = nextInt(&rng, 3) + 4;
        return 2;
    }
    else
    {
        xSetSeed(&xr, rng + sconf.salt);
        if (xNextFloat(&xr) >= sconf.rarity)
            return 0;
        int second = (xNextIntJ(&xr, 4) == 3);
        islands[0].x = xNextIntJ(&xr, 16) + x;
        islands[0].z = xNextIntJ(&xr, 16) + z;
        islands[0].y = xNextIntJ(&xr, 16) + 55;
        islands[0].r = xNextIntJ(&xr, 3) + 4;
        if (!second)
            return 1;
        for (r = islands[0].r; r > 0.5; r -= xNextIntJ(&xr, 2) + 0.5);
        islands[1].x = xNextIntJ(&xr, 16) + x;
        islands[1].z = xNextIntJ(&xr, 16) + z;
        islands[1].y = xNextIntJ(&xr, 16) + 55;
        islands[1].r = xNextIntJ(&xr, 3) + 4;
        return 2;
    }
}